

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O2

void __thiscall ProcessEstimator::~ProcessEstimator(ProcessEstimator *this)

{
  double *pdVar1;
  uint i;
  ulong uVar2;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ProcessEstimator_00156c80;
  if (this->aSample != (double *)0x0) {
    operator_delete__(this->aSample);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if (this->aDist != (double **)0x0) {
    for (uVar2 = 0; uVar2 < this->nLength; uVar2 = uVar2 + 1) {
      pdVar1 = this->aDist[uVar2];
      if (pdVar1 != (double *)0x0) {
        operator_delete__(pdVar1);
      }
    }
    operator_delete(this->aDist,8);
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ProcessEstimator::~ProcessEstimator()
{
    delete[] aSample;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aDist) {
		for(uint i=0; i<nLength; i++)
			delete[] aDist[i];
		delete aDist;
	}
}